

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O1

void send_handle_and_close(void)

{
  int iVar1;
  undefined8 uVar2;
  void *pvVar3;
  undefined8 *extraout_RDX;
  uv_pipe_t *unaff_RBX;
  uv_pipe_t *__size;
  sockaddr_in addr;
  undefined1 auStack_58 [16];
  uv_pipe_t *puStack_48;
  undefined1 auStack_40 [16];
  undefined1 auStack_30 [16];
  undefined1 local_10 [16];
  
  uVar2 = uv_default_loop();
  iVar1 = uv_tcp_init(uVar2,&tcp_server);
  if (iVar1 == 0) {
    iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,local_10);
    if (iVar1 != 0) goto LAB_00163096;
    iVar1 = uv_tcp_bind(&tcp_server,local_10,0);
    if (iVar1 != 0) goto LAB_0016309b;
    iVar1 = uv_write2(&write_req,&channel,&large_buf,1,&tcp_server,closed_handle_write_cb);
    if (iVar1 == 0) {
      uv_close(&tcp_server,0);
      return;
    }
  }
  else {
    send_handle_and_close_cold_1();
LAB_00163096:
    send_handle_and_close_cold_2();
LAB_0016309b:
    send_handle_and_close_cold_3();
  }
  send_handle_and_close_cold_4();
  puStack_48 = (uv_pipe_t *)0x1630c0;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,auStack_30);
  if (iVar1 == 0) {
    puStack_48 = (uv_pipe_t *)0x1630cd;
    uVar2 = uv_default_loop();
    puStack_48 = (uv_pipe_t *)0x1630e1;
    iVar1 = uv_pipe_init(uVar2,&channel,1);
    if (iVar1 != 0) goto LAB_0016326a;
    unaff_RBX = &channel;
    puStack_48 = (uv_pipe_t *)0x1630fa;
    uv_pipe_open(&channel,0);
    puStack_48 = (uv_pipe_t *)0x163102;
    iVar1 = uv_is_readable(&channel);
    if (iVar1 != 1) goto LAB_0016326f;
    puStack_48 = (uv_pipe_t *)0x163117;
    iVar1 = uv_is_writable(&channel);
    if (iVar1 != 1) goto LAB_00163274;
    puStack_48 = (uv_pipe_t *)0x16312c;
    iVar1 = uv_is_closing(&channel);
    if (iVar1 != 0) goto LAB_00163279;
    puStack_48 = (uv_pipe_t *)0x163145;
    auStack_40 = uv_buf_init("hello\n",6);
    puStack_48 = (uv_pipe_t *)0x163153;
    uVar2 = uv_default_loop();
    puStack_48 = (uv_pipe_t *)0x163162;
    iVar1 = uv_tcp_init(uVar2,&tcp_server);
    if (iVar1 != 0) goto LAB_0016327e;
    puStack_48 = (uv_pipe_t *)0x16316f;
    uVar2 = uv_default_loop();
    puStack_48 = (uv_pipe_t *)0x16317e;
    iVar1 = uv_tcp_init(uVar2,&tcp_server2);
    if (iVar1 != 0) goto LAB_00163283;
    puStack_48 = (uv_pipe_t *)0x163199;
    iVar1 = uv_tcp_bind(&tcp_server,auStack_30,0);
    if (iVar1 != 0) goto LAB_00163288;
    puStack_48 = (uv_pipe_t *)0x1631b4;
    iVar1 = uv_tcp_bind(&tcp_server2,auStack_30,0);
    if (iVar1 != 0) goto LAB_0016328d;
    puStack_48 = (uv_pipe_t *)0x1631e1;
    iVar1 = uv_write2(&write_req,&channel,auStack_40,1,&tcp_server,0);
    if (iVar1 != 0) goto LAB_00163292;
    puStack_48 = (uv_pipe_t *)0x16320e;
    iVar1 = uv_write2(&write_req2,&channel,auStack_40,1,&tcp_server2,0);
    if (iVar1 != 0) goto LAB_00163297;
    puStack_48 = (uv_pipe_t *)0x16321b;
    uVar2 = uv_default_loop();
    puStack_48 = (uv_pipe_t *)0x163225;
    iVar1 = uv_run(uVar2,0);
    if (iVar1 != 0) goto LAB_0016329c;
    puStack_48 = (uv_pipe_t *)0x16322e;
    unaff_RBX = (uv_pipe_t *)uv_default_loop();
    puStack_48 = (uv_pipe_t *)0x163242;
    uv_walk(unaff_RBX,close_walk_cb,0);
    puStack_48 = (uv_pipe_t *)0x16324c;
    uv_run(unaff_RBX,0);
    puStack_48 = (uv_pipe_t *)0x163251;
    uVar2 = uv_default_loop();
    puStack_48 = (uv_pipe_t *)0x163259;
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    puStack_48 = (uv_pipe_t *)0x16326a;
    ipc_helper_bind_twice_cold_1();
LAB_0016326a:
    puStack_48 = (uv_pipe_t *)0x16326f;
    ipc_helper_bind_twice_cold_2();
LAB_0016326f:
    puStack_48 = (uv_pipe_t *)0x163274;
    ipc_helper_bind_twice_cold_3();
LAB_00163274:
    puStack_48 = (uv_pipe_t *)0x163279;
    ipc_helper_bind_twice_cold_4();
LAB_00163279:
    puStack_48 = (uv_pipe_t *)0x16327e;
    ipc_helper_bind_twice_cold_5();
LAB_0016327e:
    puStack_48 = (uv_pipe_t *)0x163283;
    ipc_helper_bind_twice_cold_6();
LAB_00163283:
    puStack_48 = (uv_pipe_t *)0x163288;
    ipc_helper_bind_twice_cold_7();
LAB_00163288:
    puStack_48 = (uv_pipe_t *)0x16328d;
    ipc_helper_bind_twice_cold_8();
LAB_0016328d:
    puStack_48 = (uv_pipe_t *)0x163292;
    ipc_helper_bind_twice_cold_9();
LAB_00163292:
    puStack_48 = (uv_pipe_t *)0x163297;
    ipc_helper_bind_twice_cold_10();
LAB_00163297:
    puStack_48 = (uv_pipe_t *)0x16329c;
    ipc_helper_bind_twice_cold_11();
LAB_0016329c:
    puStack_48 = (uv_pipe_t *)0x1632a1;
    ipc_helper_bind_twice_cold_12();
  }
  puStack_48 = (uv_pipe_t *)ipc_helper_send_zero;
  ipc_helper_bind_twice_cold_13();
  puStack_48 = unaff_RBX;
  auStack_58 = uv_buf_init(0,0);
  uVar2 = uv_default_loop();
  __size = &channel;
  iVar1 = uv_pipe_init(uVar2,&channel,0);
  if (iVar1 == 0) {
    __size = (uv_pipe_t *)0x0;
    uv_pipe_open(&channel);
    iVar1 = uv_is_readable(&channel);
    if (iVar1 != 1) goto LAB_001633a9;
    iVar1 = uv_is_writable(&channel);
    if (iVar1 != 1) goto LAB_001633ae;
    iVar1 = uv_is_closing(&channel);
    if (iVar1 != 0) goto LAB_001633b3;
    __size = &channel;
    iVar1 = uv_write(&write_req,&channel,auStack_58,1,send_zero_write_cb);
    if (iVar1 != 0) goto LAB_001633b8;
    uVar2 = uv_default_loop();
    __size = (uv_pipe_t *)0x0;
    iVar1 = uv_run(uVar2);
    if (iVar1 != 0) goto LAB_001633bd;
    if (send_zero_write == 1) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      __size = (uv_pipe_t *)0x0;
      uv_run(uVar2);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_001633c7;
    }
  }
  else {
    ipc_helper_send_zero_cold_1();
LAB_001633a9:
    ipc_helper_send_zero_cold_2();
LAB_001633ae:
    ipc_helper_send_zero_cold_3();
LAB_001633b3:
    ipc_helper_send_zero_cold_4();
LAB_001633b8:
    ipc_helper_send_zero_cold_5();
LAB_001633bd:
    ipc_helper_send_zero_cold_6();
  }
  ipc_helper_send_zero_cold_7();
LAB_001633c7:
  ipc_helper_send_zero_cold_8();
  if ((int)__size == 0) {
    send_zero_write = send_zero_write + 1;
    return;
  }
  send_zero_write_cb_cold_1();
  pvVar3 = malloc((size_t)__size);
  *extraout_RDX = pvVar3;
  extraout_RDX[1] = __size;
  return;
}

Assistant:

static void send_handle_and_close() {
  int r;
  struct sockaddr_in addr;

  r = uv_tcp_init(uv_default_loop(), &tcp_server);
  ASSERT(r == 0);

  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  r = uv_tcp_bind(&tcp_server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_write2(&write_req,
                (uv_stream_t*)&channel,
                &large_buf,
                1,
                (uv_stream_t*)&tcp_server,
                closed_handle_write_cb);
  ASSERT(r == 0);

  uv_close((uv_handle_t*)&tcp_server, NULL);
}